

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

bool HasIntegerMembersInRange
               (ExternTypeInfo *type,uint fromOffset,uint toOffset,ExternTypeInfo *exTypes,
               ExternMemberInfo *exTypeExtra)

{
  uint uVar1;
  uint uVar2;
  TypeCategory TVar3;
  bool bVar4;
  uint uVar5;
  ExternTypeInfo *type_00;
  uint m;
  ulong uVar6;
  
  uVar1 = (type->field_8).arrSize;
  uVar2 = (type->field_11).subType;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = (int)uVar6 + uVar2;
    TVar3 = exTypes[exTypeExtra[uVar5].type].type;
    if ((TVar3 != TYPE_DOUBLE) && (TVar3 != TYPE_FLOAT)) {
      type_00 = exTypes + exTypeExtra[uVar5].type;
      if ((TVar3 == TYPE_COMPLEX) &&
         ((type_00->subCat == CAT_CLASS && ((type_00->field_8).arrSize != 0)))) {
        bVar4 = HasIntegerMembersInRange
                          (type_00,fromOffset - exTypeExtra[uVar5].offset,
                           toOffset - exTypeExtra[uVar5].offset,exTypes,exTypeExtra);
        if (bVar4) break;
      }
      else if ((exTypeExtra[uVar5].offset < toOffset) &&
              (fromOffset < exTypeExtra[uVar5].offset + type_00->size)) break;
    }
  }
  return uVar6 < uVar1;
}

Assistant:

bool HasIntegerMembersInRange(ExternTypeInfo &type, unsigned fromOffset, unsigned toOffset, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	for(unsigned m = 0; m < type.memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[type.memberOffset + m];

		ExternTypeInfo &memberType = exTypes[member.type];

		if(memberType.type == ExternTypeInfo::TYPE_COMPLEX)
		{
			// Handle opaque types
			bool opaqueType = memberType.subCat != ExternTypeInfo::CAT_CLASS || memberType.memberCount == 0;

			if(opaqueType)
			{
				if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
					return true;
			}
			else
			{
				if(HasIntegerMembersInRange(memberType, fromOffset - member.offset, toOffset - member.offset, exTypes, exTypeExtra))
					return true;
			}
		}
		else if(memberType.type != ExternTypeInfo::TYPE_FLOAT && memberType.type != ExternTypeInfo::TYPE_DOUBLE)
		{
			if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
				return true;
		}
	}

	return false;
}